

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O0

Vec_Int_t * Abc_NtkDressMapClasses(Aig_Man_t *pMiter,Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  Aig_Type_t AVar3;
  Vec_Int_t *p;
  Abc_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *local_68;
  int local_4c;
  int i;
  Aig_Obj_t *pObjRepr;
  Aig_Obj_t *pObjMiter;
  Aig_Obj_t *pObjMan;
  Abc_Obj_t *pAnd;
  Abc_Obj_t *pObj;
  Vec_Int_t *vId2Lit;
  Abc_Ntk_t *pNtk_local;
  Aig_Man_t *pMiter_local;
  
  p = Vec_IntAlloc(0);
  iVar1 = Abc_NtkObjNumMax(pNtk);
  Vec_IntFill(p,iVar1,-1);
  for (local_4c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_4c < iVar1; local_4c = local_4c + 1) {
    pAVar4 = Abc_NtkObj(pNtk,local_4c);
    if (((((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar4), iVar1 != 0)) &&
         (pAVar4 = Abc_ObjRegular((pAVar4->field_6).pCopy), pAVar4 != (Abc_Obj_t *)0x0)) &&
        ((uVar2 = Abc_ObjType(pAVar4), uVar2 != 0 &&
         (pAVar5 = Aig_Regular((Aig_Obj_t *)(pAVar4->field_6).pCopy), pAVar5 != (Aig_Obj_t *)0x0))))
       && ((AVar3 = Aig_ObjType(pAVar5), AVar3 != AIG_OBJ_NONE &&
           ((local_68 = Aig_Regular((Aig_Obj_t *)(pAVar5->field_5).pData),
            local_68 != (Aig_Obj_t *)0x0 && (AVar3 = Aig_ObjType(local_68), AVar3 != AIG_OBJ_NONE)))
           ))) {
      pAVar5 = Aig_ObjRepr(pMiter,local_68);
      if (pAVar5 != (Aig_Obj_t *)0x0) {
        local_68 = pAVar5;
      }
      iVar1 = Aig_ObjId(local_68);
      Vec_IntWriteEntry(p,local_4c,iVar1);
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkDressMapClasses( Aig_Man_t * pMiter, Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vId2Lit;
    Abc_Obj_t * pObj, * pAnd;
    Aig_Obj_t * pObjMan, * pObjMiter, * pObjRepr;
    int i;
    vId2Lit = Vec_IntAlloc( 0 );
    Vec_IntFill( vId2Lit, Abc_NtkObjNumMax(pNtk), -1 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        // get the pointer to the miter node corresponding to pObj
        if ( (pAnd = Abc_ObjRegular(pObj->pCopy)) && Abc_ObjType(pAnd) != ABC_OBJ_NONE &&          // strashed node is present and legal
             (pObjMan = Aig_Regular((Aig_Obj_t *)pAnd->pCopy)) && Aig_ObjType(pObjMan) != AIG_OBJ_NONE &&       // AIG node is present and legal
             (pObjMiter = Aig_Regular((Aig_Obj_t *)pObjMan->pData)) && Aig_ObjType(pObjMiter) != AIG_OBJ_NONE ) // miter node is present and legal
        {
            // get the representative of the miter node
            pObjRepr = Aig_ObjRepr( pMiter, pObjMiter );
            pObjRepr = pObjRepr? pObjRepr : pObjMiter;
            // map pObj (whose ID is i) into the repr node ID (i.e. equiv class)
            Vec_IntWriteEntry( vId2Lit, i, Aig_ObjId(pObjRepr) );
        }
    }
    return vId2Lit;
}